

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  pointer pMVar4;
  size_t _elemsize;
  void *pvVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pMVar11;
  void *pvVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  void *__dest;
  int iVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = pMVar4->dims;
  _elemsize = pMVar4->elemsize;
  pvVar5 = (this->slices).data;
  if (uVar7 == 1) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar8 != 0) {
      iVar2 = pMVar4->w;
      uVar9 = lVar8 >> 6;
      lVar17 = 0;
      lVar8 = 0;
      iVar14 = 0;
      uVar10 = 0;
      do {
        iVar18 = *(int *)((long)pvVar5 + uVar10 * 4);
        if (iVar18 == -0xe9) {
          iVar18 = (int)((ulong)((long)iVar2 - (long)iVar14) / (uVar9 + lVar8));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar17),iVar18,_elemsize,opt->blob_allocator);
        pvVar12 = *(void **)((long)&pMVar11->data + lVar17);
        if (pvVar12 == (void *)0x0) {
          bVar19 = true;
        }
        else {
          bVar19 = (long)*(int *)((long)&pMVar11->c + lVar17) *
                   *(long *)((long)&pMVar11->cstep + lVar17) == 0;
        }
        if (bVar19) {
          return -100;
        }
        memcpy(pvVar12,(void *)((long)iVar14 * _elemsize + (long)pMVar4->data),
               (long)iVar18 * _elemsize);
        iVar14 = iVar18 + iVar14;
        uVar10 = uVar10 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar11 >> 6;
        lVar8 = lVar8 + -1;
        lVar17 = lVar17 + 0x40;
      } while (uVar10 < uVar9);
    }
  }
  else {
    uVar3 = this->axis;
    if ((uVar7 ^ 2) == 0 && uVar3 == 0) {
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar8 != 0) {
        iVar2 = pMVar4->w;
        iVar14 = pMVar4->h;
        uVar9 = lVar8 >> 6;
        lVar17 = 0;
        lVar8 = 0;
        iVar18 = 0;
        uVar10 = 0;
        do {
          iVar16 = *(int *)((long)pvVar5 + uVar10 * 4);
          if (iVar16 == -0xe9) {
            iVar16 = (int)((ulong)((long)iVar14 - (long)iVar18) / (uVar9 + lVar8));
          }
          Mat::create((Mat *)((long)&pMVar11->data + lVar17),iVar2,iVar16,_elemsize,
                      opt->blob_allocator);
          pvVar12 = *(void **)((long)&pMVar11->data + lVar17);
          if (pvVar12 == (void *)0x0) {
            bVar19 = true;
          }
          else {
            bVar19 = (long)*(int *)((long)&pMVar11->c + lVar17) *
                     *(long *)((long)&pMVar11->cstep + lVar17) == 0;
          }
          if (bVar19) {
            return -100;
          }
          memcpy(pvVar12,(void *)((long)pMVar4->w * (long)iVar18 * pMVar4->elemsize +
                                 (long)pMVar4->data),(long)(iVar16 * iVar2) * _elemsize);
          iVar18 = iVar18 + iVar16;
          uVar10 = uVar10 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 6;
          lVar8 = lVar8 + -1;
          lVar17 = lVar17 + 0x40;
        } while (uVar10 < uVar9);
      }
    }
    else {
      if ((uVar7 ^ 2) != 0 || (uVar3 ^ 1) != 0) {
        uVar7 = uVar7 ^ 3;
        if (uVar7 == 0 && uVar3 == 0) {
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar8 == 0) {
            return 0;
          }
          iVar2 = pMVar4->w;
          iVar14 = pMVar4->h;
          iVar18 = pMVar4->c;
          uVar9 = lVar8 >> 6;
          lVar17 = 0;
          lVar8 = 0;
          iVar16 = 0;
          uVar10 = 0;
          while( true ) {
            iVar15 = *(int *)((long)pvVar5 + uVar10 * 4);
            if (iVar15 == -0xe9) {
              iVar15 = (int)((ulong)((long)iVar18 - (long)iVar16) / (uVar9 + lVar8));
            }
            pMVar1 = (Mat *)((long)&pMVar11->data + lVar17);
            Mat::create(pMVar1,iVar2,iVar14,iVar15,_elemsize,opt->blob_allocator);
            if (*(long *)((long)&pMVar11->data + lVar17) == 0) {
              bVar19 = true;
            }
            else {
              bVar19 = (long)*(int *)((long)&pMVar11->c + lVar17) *
                       *(long *)((long)&pMVar11->cstep + lVar17) == 0;
            }
            if (bVar19) break;
            memcpy(pMVar1->data,
                   (void *)((long)iVar16 * pMVar4->cstep * pMVar4->elemsize + (long)pMVar4->data),
                   (long)(iVar15 * (int)pMVar4->cstep) * _elemsize);
            iVar16 = iVar15 + iVar16;
            uVar10 = uVar10 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 6;
            lVar8 = lVar8 + -1;
            lVar17 = lVar17 + 0x40;
            if (uVar9 <= uVar10) {
              return 0;
            }
          }
        }
        else if ((uVar3 ^ 1) == 0 && uVar7 == 0) {
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar8 == 0) {
            return 0;
          }
          iVar2 = pMVar4->w;
          uVar7 = pMVar4->c;
          iVar14 = pMVar4->h;
          uVar9 = lVar8 >> 6;
          uVar10 = 0;
          iVar18 = 0;
          while( true ) {
            iVar16 = *(int *)((long)pvVar5 + uVar10 * 4);
            if (iVar16 == -0xe9) {
              iVar16 = (int)((ulong)((long)iVar14 - (long)iVar18) / (uVar9 - uVar10));
            }
            pMVar1 = pMVar11 + uVar10;
            Mat::create(pMVar1,iVar2,iVar16,uVar7,_elemsize,opt->blob_allocator);
            if (pMVar11[uVar10].data == (void *)0x0) {
              bVar19 = true;
            }
            else {
              bVar19 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar19) {
              if (0 < (int)uVar7) {
                uVar9 = 0;
                do {
                  memcpy((void *)(pMVar1->cstep * uVar9 * pMVar1->elemsize + (long)pMVar1->data),
                         (void *)((long)pMVar4->data +
                                 (long)pMVar4->w * (long)iVar18 * pMVar4->elemsize +
                                 pMVar4->cstep * uVar9 * pMVar4->elemsize),
                         (long)(iVar16 * iVar2) * _elemsize);
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
              }
              iVar18 = iVar18 + iVar16;
            }
            if (bVar19) break;
            uVar10 = uVar10 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 6;
            if (uVar9 <= uVar10) {
              return 0;
            }
          }
        }
        else {
          if (uVar7 != 0 || uVar3 != 2) {
            return 0;
          }
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar8 == 0) {
            return 0;
          }
          iVar2 = pMVar4->w;
          uVar7 = pMVar4->h;
          uVar3 = pMVar4->c;
          uVar9 = lVar8 >> 6;
          uVar10 = 0;
          iVar14 = 0;
          while( true ) {
            iVar18 = *(int *)((long)pvVar5 + uVar10 * 4);
            if (iVar18 == -0xe9) {
              iVar18 = (int)((ulong)((long)iVar2 - (long)iVar14) / (uVar9 - uVar10));
            }
            pMVar1 = pMVar11 + uVar10;
            Mat::create(pMVar1,iVar18,uVar7,uVar3,_elemsize,opt->blob_allocator);
            if (pMVar11[uVar10].data == (void *)0x0) {
              bVar19 = true;
            }
            else {
              bVar19 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar19) {
              if (0 < (int)uVar3) {
                uVar9 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar6 = pMVar4->elemsize;
                    iVar16 = pMVar4->w;
                    __dest = (void *)(pMVar1->cstep * uVar9 * pMVar1->elemsize + (long)pMVar1->data)
                    ;
                    pvVar12 = (void *)((long)pMVar4->data +
                                      sVar6 * pMVar4->cstep * uVar9 + (long)iVar14 * _elemsize);
                    uVar13 = (ulong)uVar7;
                    do {
                      memcpy(__dest,pvVar12,(long)iVar18 * _elemsize);
                      __dest = (void *)((long)__dest + (long)iVar18 * _elemsize);
                      pvVar12 = (void *)((long)pvVar12 + (long)iVar16 * sVar6);
                      uVar13 = uVar13 - 1;
                    } while (uVar13 != 0);
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar9 != uVar3);
              }
              iVar14 = iVar14 + iVar18;
            }
            if (bVar19) break;
            uVar10 = uVar10 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 6;
            if (uVar9 <= uVar10) {
              return 0;
            }
          }
        }
        return -100;
      }
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar8 != 0) {
        iVar2 = pMVar4->w;
        iVar14 = pMVar4->h;
        uVar9 = lVar8 >> 6;
        iVar18 = 0;
        uVar10 = 0;
        do {
          iVar16 = *(int *)((long)pvVar5 + uVar10 * 4);
          if (iVar16 == -0xe9) {
            iVar16 = (int)((ulong)((long)iVar2 - (long)iVar18) / (uVar9 - uVar10));
          }
          pMVar1 = pMVar11 + uVar10;
          Mat::create(pMVar1,iVar16,iVar14,_elemsize,opt->blob_allocator);
          if (pMVar11[uVar10].data == (void *)0x0) {
            bVar19 = true;
          }
          else {
            bVar19 = (long)pMVar1->c * pMVar1->cstep == 0;
          }
          if (!bVar19) {
            if (0 < iVar14) {
              iVar15 = 0;
              do {
                memcpy((void *)((long)pMVar1->w * (long)iVar15 * pMVar1->elemsize +
                               (long)pMVar1->data),
                       (void *)((long)pMVar4->data +
                               (long)iVar18 * _elemsize +
                               (long)pMVar4->w * (long)iVar15 * pMVar4->elemsize),
                       (long)iVar16 * _elemsize);
                iVar15 = iVar15 + 1;
              } while (iVar14 != iVar15);
            }
            iVar18 = iVar18 + iVar16;
          }
          if (bVar19) {
            return -100;
          }
          uVar10 = uVar10 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 6;
        } while (uVar10 < uVar9);
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}